

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

void __thiscall
TasGrid::GridGlobal::loadConstructedPoint(GridGlobal *this,double *x,int numx,double *y)

{
  double dVar1;
  DynamicConstructorDataGlobal *pDVar2;
  AddPointResult AVar3;
  _Fwd_list_impl _Var4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  vector<int,_std::allocator<int>_> idx;
  allocator_type local_b1;
  int *local_b0 [2];
  long local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  OneDimensionalWrapper *local_70;
  long local_68;
  long local_60;
  double *local_58;
  double *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_58 = x;
  local_50 = y;
  if (0 < numx) {
    local_60 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
    local_68 = (long)(this->super_BaseCanonicalGrid).num_outputs;
    local_70 = &this->wrapper;
    uVar5 = 0;
    do {
      getMultiIndex(&local_48,this,local_58 + uVar5 * local_60);
      pDVar2 = (this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl;
      ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)local_b0,local_50 + uVar5 * local_68,
                 local_50 + uVar5 * local_68 + (this->super_BaseCanonicalGrid).num_outputs,&local_b1
                );
      AVar3 = DynamicConstructorDataGlobal::addNewNode
                        (pDVar2,&local_48,(vector<double,_std::allocator<double>_> *)local_b0);
      if (local_b0[0] != (int *)0x0) {
        operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
      }
      if (AVar3 == tensor_missing) {
        pDVar2 = (this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl
        ;
        OneDimensionalWrapper::getLevels
                  ((vector<int,_std::allocator<int>_> *)local_b0,local_70,&local_48);
        local_98._8_8_ = 0;
        pcStack_80 = ::std::
                     _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                     ::_M_invoke;
        local_88 = ::std::
                   _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridGlobal.cpp:508:70)>
                   ::_M_manager;
        _Var4._M_head._M_next =
             (((this->dynamic_values)._M_t.
               super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl)
             ->tensors).
             super__Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>._M_impl
             ._M_head;
        dVar1 = 1.0;
        if (_Var4._M_head._M_next != (_Fwd_list_node_base)0x0) {
          uVar6 = 0;
          uVar8 = 0;
          do {
            dVar1 = *(double *)((long)_Var4._M_head._M_next + 8);
            uVar7 = SUB84(dVar1,0);
            uVar9 = (int)((ulong)dVar1 >> 0x20);
            if (dVar1 <= (double)CONCAT44(uVar8,uVar6)) {
              uVar7 = uVar6;
              uVar9 = uVar8;
            }
            _Var4._M_head._M_next = *(_Fwd_list_node_base *)_Var4._M_head._M_next;
            uVar6 = uVar7;
            uVar8 = uVar9;
          } while (_Var4._M_head._M_next != (_Fwd_list_node_base *)0x0);
          dVar1 = (double)CONCAT44(uVar9,uVar7) + 1.0;
        }
        local_98._M_unused._M_object = this;
        DynamicConstructorDataGlobal::addTensor
                  (pDVar2,local_b0[0],(function<int_(int)> *)&local_98,dVar1);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        if (local_b0[0] != (int *)0x0) {
          operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
        }
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)numx);
  }
  loadConstructedTensors(this);
  return;
}

Assistant:

void GridGlobal::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++){
        std::vector<int> idx = getMultiIndex(wrapx.getStrip(i));
        if (dynamic_values->addNewNode(idx, std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs))
            == DynamicConstructorDataGlobal::AddPointResult::tensor_missing){
            dynamic_values->addTensor(wrapper.getLevels(idx).data(), [&](int l)->int{ return wrapper.getNumPoints(l); },
                                      dynamic_values->getMaxTensorWeight() + 1.0);
        }
    }
    loadConstructedTensors();
}